

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

void re2::AddUGroup(CharClassBuilder *cc,UGroup *g,int sign,ParseFlags parse_flags)

{
  URange32 *pUVar1;
  int iVar2;
  URange16 *pUVar3;
  URange32 *pUVar4;
  uint lo;
  long lVar5;
  CharClassBuilder ccb1;
  CharClassBuilder local_60;
  
  if (sign == 1) {
    if (0 < g->nr16) {
      lVar5 = 0;
      do {
        CharClassBuilder::AddRangeFlags
                  (cc,(uint)g->r16[lVar5].lo,(uint)g->r16[lVar5].hi,parse_flags);
        lVar5 = lVar5 + 1;
      } while (lVar5 < g->nr16);
    }
    if (0 < g->nr32) {
      lVar5 = 0;
      do {
        CharClassBuilder::AddRangeFlags(cc,g->r32[lVar5].lo,g->r32[lVar5].hi,parse_flags);
        lVar5 = lVar5 + 1;
      } while (lVar5 < g->nr32);
    }
  }
  else {
    if ((parse_flags & FoldCase) == NoParseFlags) {
      iVar2 = g->nr16;
      if (iVar2 < 1) {
        lo = 0;
      }
      else {
        pUVar3 = g->r16;
        lVar5 = 0;
        lo = 0;
        do {
          if (lo < pUVar3[lVar5].lo) {
            CharClassBuilder::AddRangeFlags(cc,lo,pUVar3[lVar5].lo - 1,parse_flags);
            pUVar3 = g->r16;
            iVar2 = g->nr16;
          }
          lo = pUVar3[lVar5].hi + 1;
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar2);
      }
      iVar2 = g->nr32;
      if (0 < iVar2) {
        pUVar4 = g->r32;
        lVar5 = 0;
        do {
          if ((int)lo < pUVar4[lVar5].lo) {
            CharClassBuilder::AddRangeFlags(cc,lo,pUVar4[lVar5].lo + -1,parse_flags);
            pUVar4 = g->r32;
            iVar2 = g->nr32;
          }
          pUVar1 = pUVar4 + lVar5;
          lo = pUVar1->hi + 1;
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar2);
        if (0x10fffe < pUVar1->hi) {
          return;
        }
      }
      CharClassBuilder::AddRangeFlags(cc,lo,0x10ffff,parse_flags);
      return;
    }
    CharClassBuilder::CharClassBuilder(&local_60);
    AddUGroup(&local_60,g,1,parse_flags);
    if ((parse_flags & (NeverNL|ClassNL)) != ClassNL) {
      CharClassBuilder::AddRange(&local_60,10,10);
    }
    CharClassBuilder::Negate(&local_60);
    CharClassBuilder::AddCharClass(cc,&local_60);
    std::
    _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
    ::~_Rb_tree(&local_60.ranges_._M_t);
  }
  return;
}

Assistant:

static void AddUGroup(CharClassBuilder *cc, const UGroup *g, int sign,
                      Regexp::ParseFlags parse_flags) {
  if (sign == +1) {
    for (int i = 0; i < g->nr16; i++) {
      cc->AddRangeFlags(g->r16[i].lo, g->r16[i].hi, parse_flags);
    }
    for (int i = 0; i < g->nr32; i++) {
      cc->AddRangeFlags(g->r32[i].lo, g->r32[i].hi, parse_flags);
    }
  } else {
    if (parse_flags & Regexp::FoldCase) {
      // Normally adding a case-folded group means
      // adding all the extra fold-equivalent runes too.
      // But if we're adding the negation of the group,
      // we have to exclude all the runes that are fold-equivalent
      // to what's already missing.  Too hard, so do in two steps.
      CharClassBuilder ccb1;
      AddUGroup(&ccb1, g, +1, parse_flags);
      // If the flags say to take out \n, put it in, so that negating will take it out.
      // Normally AddRangeFlags does this, but we're bypassing AddRangeFlags.
      bool cutnl = !(parse_flags & Regexp::ClassNL) ||
                   (parse_flags & Regexp::NeverNL);
      if (cutnl) {
        ccb1.AddRange('\n', '\n');
      }
      ccb1.Negate();
      cc->AddCharClass(&ccb1);
      return;
    }
    int next = 0;
    for (int i = 0; i < g->nr16; i++) {
      if (next < g->r16[i].lo)
        cc->AddRangeFlags(next, g->r16[i].lo - 1, parse_flags);
      next = g->r16[i].hi + 1;
    }
    for (int i = 0; i < g->nr32; i++) {
      if (next < g->r32[i].lo)
        cc->AddRangeFlags(next, g->r32[i].lo - 1, parse_flags);
      next = g->r32[i].hi + 1;
    }
    if (next <= Runemax)
      cc->AddRangeFlags(next, Runemax, parse_flags);
  }
}